

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_probe_side_optimizer.cpp
# Opt level: O2

BuildSize duckdb::BuildProbeSideOptimizer::GetBuildSizes
                    (LogicalOperator *op,idx_t lhs_cardinality,idx_t rhs_cardinality)

{
  const_reference pvVar1;
  pointer pLVar2;
  double dVar3;
  double dVar4;
  BuildSize BVar5;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  
  if ((byte)(op->type - LOGICAL_DELIM_JOIN) < 4) {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(&op->children,0);
    pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar1);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_38,
               &(pLVar2->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    dVar3 = GetBuildSize((vector<duckdb::LogicalType,_true> *)&local_38,lhs_cardinality);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
    pvVar1 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(&op->children,1);
    pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar1);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_50,
               &(pLVar2->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    dVar4 = GetBuildSize((vector<duckdb::LogicalType,_true> *)&local_50,rhs_cardinality);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_50);
  }
  else {
    dVar4 = 1.0;
    dVar3 = 1.0;
  }
  BVar5.right_side = dVar4;
  BVar5.left_side = dVar3;
  return BVar5;
}

Assistant:

BuildSize BuildProbeSideOptimizer::GetBuildSizes(const LogicalOperator &op, const idx_t lhs_cardinality,
                                                 const idx_t rhs_cardinality) {
	BuildSize ret;
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT:
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
	case LogicalOperatorType::LOGICAL_DELIM_JOIN: {
		ret.left_side = GetBuildSize(op.children[0]->types, lhs_cardinality);
		ret.right_side = GetBuildSize(op.children[1]->types, rhs_cardinality);
		return ret;
	}
	default:
		break;
	}
	return ret;
}